

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_vm.hpp
# Opt level: O1

void __thiscall squall::VM::~VM(VM *this)

{
  TableBase *pTVar1;
  
  sq_setforeignptr((this->imp_).vm_,(SQUserPointer)0x0);
  pTVar1 = (this->root_table_)._M_t.
           super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
           super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
           super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl;
  if (pTVar1 != (TableBase *)0x0) {
    (*pTVar1->_vptr_TableBase[1])();
  }
  (this->root_table_)._M_t.
  super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
  super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
  super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl = (TableBase *)0x0;
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<squall::detail::KlassImpBase>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->klass_table_);
  sq_close((this->imp_).vm_);
  return;
}

Assistant:

~VM() { sq_setforeignptr(handle(), 0); }